

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Array2D<float> * __thiscall
pbrt::Sample2DFunction
          (Array2D<float> *__return_storage_ptr__,pbrt *this,function<float_(float,_float)> *f,
          int nu,int nv,int nSamples,Bounds2f domain,Allocator alloc)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 in_register_0000008c;
  Allocator allocator;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  float fVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  float fVar17;
  undefined8 in_XMM1_Qb;
  undefined1 auVar18 [16];
  Float invBase_1;
  undefined1 auVar19 [16];
  undefined4 in_XMM7_Da;
  undefined1 in_register_000013c4 [12];
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> samples;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_c0;
  int local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  undefined4 local_94;
  Bounds2i local_90;
  ulong local_80;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  allocator.memoryResource._4_4_ = in_register_0000008c;
  allocator.memoryResource._0_4_ = nSamples;
  local_68 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_64 = domain.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  local_78 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_74 = domain.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  uVar6 = (uint)f;
  uStack_70 = in_XMM0_Qb;
  uStack_60 = in_XMM1_Qb;
  std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
            (&local_c0,(long)nv,(allocator_type *)&local_90);
  if (0 < nv) {
    uVar8 = 0;
    do {
      auVar12 = ZEXT816(0) << 0x40;
      auVar19 = ZEXT816(0) << 0x40;
      if (uVar8 != 0) {
        fVar13 = 1.0;
        lVar9 = 0;
        uVar7 = uVar8;
        do {
          lVar9 = (lVar9 - uVar7 / 2) * 2 + uVar7;
          fVar13 = fVar13 * 0.5;
          bVar11 = 1 < uVar7;
          uVar7 = uVar7 / 2;
        } while (bVar11);
        auVar19._4_12_ = in_register_000013c4;
        auVar19._0_4_ = in_XMM7_Da;
        auVar19 = vcvtusi2ss_avx512f(auVar19,lVar9);
        auVar19 = ZEXT416((uint)(fVar13 * auVar19._0_4_));
      }
      if (uVar8 != 0) {
        fVar13 = 1.0;
        lVar9 = 0;
        uVar7 = uVar8;
        do {
          lVar9 = (lVar9 - uVar7 / 3) * 3 + uVar7;
          fVar13 = fVar13 * 0.33333334;
          bVar11 = 2 < uVar7;
          uVar7 = uVar7 / 3;
        } while (bVar11);
        auVar12._4_12_ = in_register_000013c4;
        auVar12._0_4_ = in_XMM7_Da;
        auVar12 = vcvtusi2ss_avx512f(auVar12,lVar9);
        auVar12 = ZEXT416((uint)(fVar13 * auVar12._0_4_));
      }
      auVar19 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar19);
      auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar12);
      local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8].super_Tuple2<pbrt::Point2,_float>.x =
           auVar19._0_4_;
      local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar8].super_Tuple2<pbrt::Point2,_float>.y =
           auVar12._0_4_;
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nv);
  }
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x3f800000;
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  local_90.pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)vmovlps_avx(auVar14);
  std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>::
  emplace_back<pbrt::Point2<float>>
            ((vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>> *)&local_c0,
             (Point2<float> *)&local_90);
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar6 >> 0x1f & uVar6;
  local_90.pMin.super_Tuple2<pbrt::Point2,_int>.y = nu >> 0x1f & nu;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar6) {
    uVar7 = (ulong)f & 0xffffffff;
  }
  if (0 < nu) {
    uVar8 = (ulong)(uint)nu;
  }
  local_90.pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar7 | uVar8 << 0x20)
  ;
  Array2D<float>::Array2D(__return_storage_ptr__,&local_90,allocator);
  if (0 < nu) {
    local_a0 = (float)(int)uVar6;
    local_a4 = (float)nu;
    auVar3._4_4_ = fStack_74;
    auVar3._0_4_ = local_78;
    auVar3._8_8_ = uStack_70;
    local_48 = vmovshdup_avx(auVar3);
    auVar4._4_4_ = fStack_64;
    auVar4._0_4_ = local_68;
    auVar4._8_8_ = uStack_60;
    local_58 = vmovshdup_avx(auVar4);
    iVar5 = 0;
    local_a8 = nu;
    do {
      if (0 < (int)uVar6) {
        local_9c = (float)iVar5;
        uVar10 = 0;
        do {
          if (local_c0.
              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish ==
              local_c0.
              super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl
              .super__Vector_impl_data._M_start) {
            fVar13 = 0.0;
          }
          else {
            local_98 = (float)(int)uVar10;
            auVar12 = ZEXT816(0);
            uVar8 = 0;
            do {
              local_80 = auVar12._0_8_;
              fVar13 = (local_98 +
                       local_c0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].
                       super_Tuple2<pbrt::Point2,_float>.x) / local_a0;
              fVar17 = (local_9c +
                       local_c0.
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar8].
                       super_Tuple2<pbrt::Point2,_float>.y) / local_a4;
              auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar13 * local_68)),
                                        ZEXT416((uint)(1.0 - fVar13)),ZEXT416((uint)local_78));
              auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * (float)local_58._0_4_)),
                                        ZEXT416((uint)(1.0 - fVar17)),ZEXT416((uint)local_48._0_4_))
              ;
              local_90.pMin.super_Tuple2<pbrt::Point2,_int>.x = auVar12._0_4_;
              local_94 = auVar19._0_4_;
              if (*(long *)(this + 0x10) == 0) {
                std::__throw_bad_function_call();
              }
              auVar16._0_8_ = (**(code **)(this + 0x18))(this,&local_90,&local_94);
              auVar16._8_56_ = extraout_var;
              auVar2._8_4_ = 0x7fffffff;
              auVar2._0_8_ = 0x7fffffff7fffffff;
              auVar2._12_4_ = 0x7fffffff;
              auVar12 = vandps_avx512vl(auVar16._0_16_,auVar2);
              auVar15._0_8_ = (double)auVar12._0_4_;
              auVar15._8_8_ = auVar12._8_8_;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_80;
              auVar12 = vmaxsd_avx(auVar15,auVar18);
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)((long)local_c0.
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_c0.
                                           super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3));
            fVar13 = (float)auVar12._0_8_;
          }
          iVar1 = (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
          __return_storage_ptr__->values
          [(int)(((__return_storage_ptr__->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1) *
                 (iVar5 - (__return_storage_ptr__->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) +
                (uVar10 - iVar1))] = fVar13;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar6);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != local_a8);
  }
  if (local_c0.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Float> Sample2DFunction(std::function<Float(Float, Float)> f, int nu, int nv,
                                int nSamples, Bounds2f domain, Allocator alloc) {
    std::vector<Point2f> samples(nSamples);
    for (int i = 0; i < nSamples; ++i)
        samples[i] = Point2f(RadicalInverse(0, i), RadicalInverse(1, i));
    // Check the corners, too.
    samples.push_back(Point2f(0, 1));
    samples.push_back(Point2f(1, 0));
    samples.push_back(Point2f(1, 1));

    Array2D<Float> values(nu, nv, alloc);
    for (int v = 0; v < nv; ++v) {
        for (int u = 0; u < nu; ++u) {
            double accum = 0;
            for (size_t i = 0; i < samples.size(); ++i) {
                Point2f p = domain.Lerp(
                    Point2f((u + samples[i][0]) / nu, (v + samples[i][1]) / nv));
                Float fuv = std::abs(f(p.x, p.y));
                accum = std::max<double>(accum, fuv);
            }
            // There's actually no need for the divide by nSamples, since
            // these are normalzed into a PDF anyway.
            values(u, v) = accum;
        }
    }

    return values;
}